

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NormalizerValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)607>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  SupportVectorClassifier *pSVar4;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *interface;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  allocator_type local_a1;
  pointer local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_78;
  TypeCase local_5c;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  undefined1 local_48 [24];
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result((Result *)&local_a0);
  validateModelDescription((Result *)local_58,interface,format->specificationversion_);
  local_a0 = (pointer)local_58;
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
  pcVar2 = local_48 + 8;
  if (local_50._M_p != pcVar2) {
    operator_delete(local_50._M_p,local_48._8_8_ + 1);
  }
  bVar3 = Result::good((Result *)&local_a0);
  if (bVar3) {
    local_5c = kMultiArrayType;
    __l._M_len = 1;
    __l._M_array = &local_5c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_78,__l,&local_a1);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_58,(CoreML *)&interface->input_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_78,
               in_R8);
    local_a0 = (pointer)local_58;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
    if (local_50._M_p != pcVar2) {
      operator_delete(local_50._M_p,local_48._8_8_ + 1);
    }
    if (local_78.
        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar3 = Result::good((Result *)&local_a0);
    if (bVar3) {
      local_5c = kMultiArrayType;
      __l_00._M_len = 1;
      __l_00._M_array = &local_5c;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_78,__l_00,&local_a1);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_58,(CoreML *)&interface->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_78,
                 in_R8);
      local_a0 = (pointer)local_58;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
      if (local_50._M_p != pcVar2) {
        operator_delete(local_50._M_p,local_48._8_8_ + 1);
      }
      if (local_78.
          super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = Result::good((Result *)&local_a0);
      if (bVar3) {
        if (format->_oneof_case_[0] == 0x25f) {
          pSVar4 = (format->Type_).supportvectorclassifier_;
        }
        else {
          pSVar4 = (SupportVectorClassifier *)Specification::Normalizer::default_instance();
        }
        if (2 < (uint)(pSVar4->numberofsupportvectorsperclass_).current_size_) {
          local_58 = (undefined1  [8])local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_58,"NormalizerValidator normLx invalid","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_58);
          if (local_58 != (undefined1  [8])local_48) {
            operator_delete((void *)local_58,local_48._0_8_ + 1);
          }
          goto LAB_002a089f;
        }
      }
    }
  }
  *(pointer *)__return_storage_ptr__ = local_a0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p == &local_88) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_88._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_98._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_90;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
LAB_002a089f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,
                    CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_normalizer>(const Specification::Model& format) {
        const auto& interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the parameters
        auto normLx = format.normalizer().normtype();
        if (normLx != Specification::Normalizer_NormType::Normalizer_NormType_L1 &&
            normLx != Specification::Normalizer_NormType::Normalizer_NormType_L2 &&
            normLx != Specification::Normalizer_NormType::Normalizer_NormType_LMax) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "NormalizerValidator normLx invalid");
        }
        
        return result;
    }